

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Lms_Man_t * Lms_ManStart(Gia_Man_t *pGia,int nVars,int nCuts,int fFuncOnly,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Lms_Man_t *pLVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar8;
  int *piVar9;
  word *pEntry;
  Gia_Man_t *p_00;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  timespec ts;
  timespec local_60;
  Lms_Man_t *local_50;
  Vec_Int_t *local_48;
  Gia_Man_t *local_40;
  long local_38;
  
  local_48 = (Vec_Int_t *)CONCAT44(local_48._4_4_,fFuncOnly);
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if (pGia != (Gia_Man_t *)0x0) {
    nVars = pGia->vCis->nSize;
  }
  if (10 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x137,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
  }
  local_50 = (Lms_Man_t *)calloc(1,0x40d8);
  local_50->nVars = nVars;
  local_50->nCuts = nCuts;
  iVar4 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if (nVars < 7) {
    iVar4 = 1;
  }
  local_50->nWords = iVar4;
  local_50->fFuncOnly = (int)local_48;
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar4;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  local_50->vTtMem = p;
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar18 = 9999;
  while( true ) {
    do {
      uVar17 = uVar18;
      uVar18 = uVar17 + 1;
    } while ((uVar17 & 1) != 0);
    if (uVar18 < 9) break;
    iVar4 = 5;
    while (uVar18 % (iVar4 - 2U) != 0) {
      uVar5 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar18 < uVar5) goto LAB_00287076;
    }
  }
LAB_00287076:
  local_40 = pGia;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar17) {
    uVar5 = uVar18;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar5;
  piVar9 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar18;
  memset(piVar9,0xff,(long)(int)uVar18 << 2);
  p->vTable = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 10000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(40000);
  pVVar8->pArray = piVar9;
  p->vNexts = pVVar8;
  if ((int)local_48 == 0) {
    local_38 = lVar14;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 10000;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(40000);
    pLVar3 = local_50;
    pVVar8->pArray = piVar9;
    local_50->vTruthIds = pVVar8;
    local_48 = pVVar8;
    if (local_40 == (Gia_Man_t *)0x0) {
      p_00 = Gia_ManStart(10000);
      pLVar3->pGia = p_00;
      pcVar10 = (char *)malloc(7);
      builtin_strncpy(pcVar10,"record",7);
      p_00->pName = pcVar10;
      if (0 < nVars) {
        do {
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar2 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar2 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar2 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar1 = p_00->pObjs;
          if ((pGVar11 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar11)) {
LAB_002874cf:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar1) >> 2) * -0x55555555);
          if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_002874cf;
          nVars = nVars + -1;
        } while (nVars != 0);
      }
    }
    else {
      local_50->pGia = local_40;
      pVVar8 = local_40->vCos;
      iVar4 = pVVar8->nSize;
      local_50->nAdded = iVar4;
      if (0 < iVar4) {
        lVar14 = 0;
        iVar4 = -1;
        do {
          iVar7 = pVVar8->pArray[lVar14];
          if (((long)iVar7 < 0) || (local_40->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = local_40->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          iVar6 = clock_gettime(3,&local_60);
          if (iVar6 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          pEntry = Gia_ObjComputeTruthTable(local_40,pGVar1 + iVar7);
          iVar7 = clock_gettime(3,&local_60);
          pLVar3 = local_50;
          if (iVar7 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          local_50->timeTruth = local_50->timeTruth + lVar16 + lVar15;
          iVar7 = clock_gettime(3,&local_60);
          if (iVar7 < 0) {
            lVar15 = 1;
          }
          else {
            lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
            lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_60.tv_sec * -1000000;
          }
          iVar7 = Vec_MemHashInsert(p,pEntry);
          iVar6 = clock_gettime(3,&local_60);
          if (iVar6 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          pLVar3->timeInsert = pLVar3->timeInsert + lVar16 + lVar15;
          if (iVar7 != iVar4 + 1 && iVar7 != iVar4) {
            __assert_fail("Index == Prev || Index == Prev + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                          ,0x15f,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
          }
          Vec_IntPush(local_48,iVar7);
          lVar14 = lVar14 + 1;
          pVVar8 = local_40->vCos;
          iVar4 = iVar7;
        } while (lVar14 < pVVar8->nSize);
      }
    }
    pVVar12 = (Vec_Ptr_t *)malloc(0x10);
    pVVar12->nCap = 1000;
    pVVar12->nSize = 0;
    ppvVar13 = (void **)malloc(8000);
    pLVar3 = local_50;
    pVVar12->pArray = ppvVar13;
    local_50->vNodes = pVVar12;
    pVVar12 = (Vec_Ptr_t *)malloc(0x10);
    pVVar12->nCap = 1000;
    pVVar12->nSize = 0;
    ppvVar13 = (void **)malloc(8000);
    pVVar12->pArray = ppvVar13;
    pLVar3->vLabelsP = pVVar12;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar8->pArray = piVar9;
    pLVar3->vLabels = pVVar8;
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    pLVar3->timeTotal = pLVar3->timeTotal + lVar14 + local_38;
  }
  return local_50;
}

Assistant:

Lms_Man_t * Lms_ManStart( Gia_Man_t * pGia, int nVars, int nCuts, int fFuncOnly, int fVerbose )
{
    Lms_Man_t * p;
    abctime clk, clk2 = Abc_Clock();
    // if GIA is given, use the number of variables from GIA
    nVars = pGia ? Gia_ManCiNum(pGia) : nVars;
    assert( nVars >= 6 && nVars <= LMS_VAR_MAX );
    // allocate manager
    p = ABC_CALLOC( Lms_Man_t, 1 );
    // parameters
    p->nVars = nVars;
    p->nCuts = nCuts;
    p->nWords = Abc_Truth6WordNum( nVars );
    p->fFuncOnly = fFuncOnly;
    // internal data for library construction
    p->vTtMem = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
//    p->vTtMem2 = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
    Vec_MemHashAlloc( p->vTtMem, 10000 );
//    Vec_MemHashAlloc( p->vTtMem2, 10000 );
    if ( fFuncOnly )
        return p;    
    p->vTruthIds = Vec_IntAlloc( 10000 );
    if ( pGia == NULL )
    {
        int i;
        p->pGia = Gia_ManStart( 10000 );
        p->pGia->pName = Abc_UtilStrsav( "record" );
        for ( i = 0; i < nVars; i++ )
            Gia_ManAppendCi( p->pGia );
    }
    else
    {
        Gia_Obj_t * pObj;
        word * pTruth;
        int i, Index, Prev = -1;
        p->pGia = pGia;
        // populate the manager with subgraphs present in GIA
        p->nAdded = Gia_ManCoNum( p->pGia );
        Gia_ManForEachCo( p->pGia, pObj, i )
        {
            clk = Abc_Clock();
            pTruth = Gia_ObjComputeTruthTable( p->pGia, pObj );
            p->timeTruth += Abc_Clock() - clk;
            clk = Abc_Clock();
            Index = Vec_MemHashInsert( p->vTtMem, pTruth );
            p->timeInsert += Abc_Clock() - clk;
            assert( Index == Prev || Index == Prev + 1 ); // GIA subgraphs should be ordered
            Vec_IntPush( p->vTruthIds, Index );
            Prev = Index;
        }
    }
    // temporaries
    p->vNodes    = Vec_PtrAlloc( 1000 );
    p->vLabelsP  = Vec_PtrAlloc( 1000 );
    p->vLabels   = Vec_IntAlloc( 1000 );
p->timeTotal += Abc_Clock() - clk2;
    return p;    
}